

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

void iniparser_dumpsection_ini(dictionary *d,char *s,FILE *f)

{
  char *__s1;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char keym [1025];
  
  if (f != (FILE *)0x0 && d != (dictionary *)0x0) {
    iVar1 = iniparser_find_entry(d,s);
    if (iVar1 != 0) {
      sVar2 = strlen(s);
      fprintf((FILE *)f,"\n[%s]\n",s);
      sprintf(keym,"%s:",s);
      for (lVar4 = 0; lVar4 < d->size; lVar4 = lVar4 + 1) {
        __s1 = d->key[lVar4];
        if (__s1 != (char *)0x0) {
          iVar1 = strncmp(__s1,keym,(long)((int)sVar2 + 1));
          if (iVar1 == 0) {
            pcVar3 = d->val[lVar4];
            if (pcVar3 == (char *)0x0) {
              pcVar3 = "";
            }
            fprintf((FILE *)f,"%-30s = %s\n",__s1 + (long)(int)sVar2 + 1,pcVar3);
          }
        }
      }
      fputc(10,(FILE *)f);
      return;
    }
  }
  return;
}

Assistant:

void iniparser_dumpsection_ini(const dictionary * d, const char * s, FILE * f)
{
    int     j ;
    char    keym[ASCIILINESZ + 1];
    int     seclen ;

    if (d == NULL || f == NULL) return ;
    if (! iniparser_find_entry(d, s)) return ;

    seclen  = (int)strlen(s);
    fprintf(f, "\n[%s]\n", s);
    sprintf(keym, "%s:", s);
    for (j = 0 ; j < d->size ; j++) {
        if (d->key[j] == NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen + 1)) {
            fprintf(f,
                    "%-30s = %s\n",
                    d->key[j] + seclen + 1,
                    d->val[j] ? d->val[j] : "");
        }
    }
    fprintf(f, "\n");
    return ;
}